

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void scm_randomize(void)

{
  uint uVar1;
  result_type_conflict rVar2;
  result_type_conflict rVar3;
  ulong uVar4;
  ulong uVar5;
  int y;
  int iVar6;
  int x;
  cell_map cStack_2758;
  random_device rd;
  mt19937 gen;
  
  scm_stop();
  std::random_device::random_device(&rd);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar1);
  cell_map::cell_map(&cStack_2758,width,height);
  cell_map::operator=(&grid,&cStack_2758);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&cStack_2758.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  uVar5 = (ulong)(uint)height;
  for (iVar6 = 0; iVar6 < ((int)uVar5 * width) / 2; iVar6 = iVar6 + 1) {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&gen);
    uVar4 = (ulong)width;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&gen);
    uVar5 = (ulong)height;
    y = (int)(rVar3 % uVar5);
    x = (int)(rVar2 % uVar4);
    if ((grid.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[grid.width * y + x] & 1) == 0) {
      cell_map::set_cell(&grid,x,y);
      uVar5 = (ulong)(uint)height;
    }
  }
  paint_grid();
  std::random_device::~random_device(&rd);
  return;
}

Assistant:

void scm_randomize()
  {
  scm_stop();
  std::random_device rd;
  std::mt19937 gen(rd());

  grid = cell_map(width, height);

  for (int i = 0; i < width*height / 2; ++i)
    {
    int x = gen() % width;
    int y = gen() % height;
    if (grid.cell_state(x, y) == 0)
      grid.set_cell(x, y);
    }
  paint_grid();
  }